

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int generateOutputSubroutine
              (Parse *pParse,Select *p,SelectDest *pIn,SelectDest *pDest,int regReturn,int regPrev,
              KeyInfo *pKeyInfo,int iBreak)

{
  Parse *p_00;
  int iVar1;
  int iReg;
  int iVar2;
  byte *in_RCX;
  Parse *pParse_00;
  long in_RDX;
  long in_RSI;
  Parse *in_RDI;
  int in_R9D;
  KeyInfo *in_stack_00000008;
  int r1_1;
  int r2;
  int r1;
  int addr2;
  int addr1;
  int addr;
  int iContinue;
  Vdbe *v;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Vdbe *in_stack_ffffffffffffff90;
  Parse *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int local_4;
  
  p_00 = (Parse *)in_RDI->pVdbe;
  local_4 = sqlite3VdbeCurrentAddr((Vdbe *)p_00);
  sqlite3VdbeMakeLabel(in_RDI);
  if (in_R9D != 0) {
    sqlite3VdbeAddOp1(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
    ;
    in_stack_ffffffffffffffa0 = *(int *)(in_RDX + 0xc);
    in_stack_ffffffffffffffa4 = in_R9D + 1;
    in_stack_ffffffffffffffa8 = *(undefined4 *)(in_RDX + 0x10);
    in_stack_ffffffffffffff98 = p_00;
    sqlite3KeyInfoRef(in_stack_00000008);
    in_stack_ffffffffffffff88 = -8;
    sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98
                      ,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (int)in_stack_ffffffffffffff90,
                      (char *)CONCAT44(in_stack_ffffffffffffff8c,0xfffffff8),
                      in_stack_ffffffffffffffb0);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                      (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98
                     );
    sqlite3VdbeJumpHere(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                      (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98
                     );
    sqlite3VdbeAddOp2(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                      0);
  }
  if (in_RDI->db->mallocFailed == '\0') {
    codeOffset(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    pParse_00 = (Parse *)(ulong)(*in_RCX - 10);
    switch(pParse_00) {
    case (Parse *)0x0:
      sqlite3ExprCodeMove(pParse_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      break;
    case (Parse *)0x1:
      iVar1 = sqlite3GetTempReg(in_RDI);
      in_stack_ffffffffffffff88 = *(int *)(in_RDX + 0x10);
      sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (int)in_stack_ffffffffffffff98,(int)((ulong)pParse_00 >> 0x20),
                        (int)pParse_00,
                        (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        in_stack_ffffffffffffffb0);
      sqlite3VdbeAddOp4Int
                ((Vdbe *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4,
                 in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                 (int)in_stack_ffffffffffffff98,(int)((ulong)pParse_00 >> 0x20));
      if (0 < *(int *)(in_RCX + 8)) {
        sqlite3VdbeAddOp4Int
                  ((Vdbe *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa4,
                   in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (int)in_stack_ffffffffffffff98,(int)((ulong)pParse_00 >> 0x20));
        sqlite3VdbeExplain(in_RDI,'\0',"CREATE BLOOM FILTER");
      }
      iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      sqlite3ReleaseTempReg(in_RDI,iVar1);
      break;
    case (Parse *)0x2:
      iVar1 = sqlite3GetTempReg(in_RDI);
      iReg = sqlite3GetTempReg(in_RDI);
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (int)in_stack_ffffffffffffff98);
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                        (int)in_stack_ffffffffffffff98);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      sqlite3VdbeChangeP5((Vdbe *)p_00,8);
      sqlite3ReleaseTempReg(in_RDI,iReg);
      sqlite3ReleaseTempReg(in_RDI,iVar1);
      break;
    case (Parse *)0x3:
      if (*(int *)(in_RCX + 0xc) == 0) {
        iVar2 = sqlite3GetTempRange(in_stack_ffffffffffffff98,0);
        *(int *)(in_RCX + 0xc) = iVar2;
        *(undefined4 *)(in_RCX + 0x10) = *(undefined4 *)(in_RDX + 0x10);
      }
      iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      sqlite3ExprCodeMove(pParse_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
      sqlite3VdbeAddOp1((Vdbe *)pParse_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      break;
    default:
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    }
    if (*(int *)(in_RSI + 8) != 0) {
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,0);
    }
    sqlite3VdbeResolveLabel
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),iVar2);
    sqlite3VdbeAddOp1((Vdbe *)pParse_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int generateOutputSubroutine(
  Parse *pParse,          /* Parsing context */
  Select *p,              /* The SELECT statement */
  SelectDest *pIn,        /* Coroutine supplying data */
  SelectDest *pDest,      /* Where to send the data */
  int regReturn,          /* The return address register */
  int regPrev,            /* Previous result register.  No uniqueness if 0 */
  KeyInfo *pKeyInfo,      /* For comparing with previous entry */
  int iBreak              /* Jump here if we hit the LIMIT */
){
  Vdbe *v = pParse->pVdbe;
  int iContinue;
  int addr;

  addr = sqlite3VdbeCurrentAddr(v);
  iContinue = sqlite3VdbeMakeLabel(pParse);

  /* Suppress duplicates for UNION, EXCEPT, and INTERSECT
  */
  if( regPrev ){
    int addr1, addr2;
    addr1 = sqlite3VdbeAddOp1(v, OP_IfNot, regPrev); VdbeCoverage(v);
    addr2 = sqlite3VdbeAddOp4(v, OP_Compare, pIn->iSdst, regPrev+1, pIn->nSdst,
                              (char*)sqlite3KeyInfoRef(pKeyInfo), P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr2+2, iContinue, addr2+2); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp3(v, OP_Copy, pIn->iSdst, regPrev+1, pIn->nSdst-1);
    sqlite3VdbeAddOp2(v, OP_Integer, 1, regPrev);
  }
  if( pParse->db->mallocFailed ) return 0;

  /* Suppress the first OFFSET entries if there is an OFFSET clause
  */
  codeOffset(v, p->iOffset, iContinue);

  assert( pDest->eDest!=SRT_Exists );
  assert( pDest->eDest!=SRT_Table );
  switch( pDest->eDest ){
    /* Store the result as data using a unique key.
    */
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      int r2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, r1);
      sqlite3VdbeAddOp2(v, OP_NewRowid, pDest->iSDParm, r2);
      sqlite3VdbeAddOp3(v, OP_Insert, pDest->iSDParm, r1, r2);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      sqlite3ReleaseTempReg(pParse, r2);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)".
    */
    case SRT_Set: {
      int r1;
      testcase( pIn->nSdst>1 );
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst,
          r1, pDest->zAffSdst, pIn->nSdst);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pDest->iSDParm, r1,
                           pIn->iSdst, pIn->nSdst);
      if( pDest->iSDParm2>0 ){
        sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pDest->iSDParm2, 0,
                             pIn->iSdst, pIn->nSdst);
        ExplainQueryPlan((pParse, 0, "CREATE BLOOM FILTER"));
      }
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.  Note that the select might return multiple columns
    ** if it is the RHS of a row-value IN operator.
    */
    case SRT_Mem: {
      testcase( pIn->nSdst>1 );
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSDParm, pIn->nSdst);
      /* The LIMIT clause will jump out of the loop for us */
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* The results are stored in a sequence of registers
    ** starting at pDest->iSdst.  Then the co-routine yields.
    */
    case SRT_Coroutine: {
      if( pDest->iSdst==0 ){
        pDest->iSdst = sqlite3GetTempRange(pParse, pIn->nSdst);
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSdst, pIn->nSdst);
      sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      break;
    }

    /* If none of the above, then the result destination must be
    ** SRT_Output.  This routine is never called with any other
    ** destination other than the ones handled above or SRT_Output.
    **
    ** For SRT_Output, results are stored in a sequence of registers.
    ** Then the OP_ResultRow opcode is used to cause sqlite3_step() to
    ** return the next row of result.
    */
    default: {
      assert( pDest->eDest==SRT_Output );
      sqlite3VdbeAddOp2(v, OP_ResultRow, pIn->iSdst, pIn->nSdst);
      break;
    }
  }

  /* Jump to the end of the loop if the LIMIT is reached.
  */
  if( p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }

  /* Generate the subroutine return
  */
  sqlite3VdbeResolveLabel(v, iContinue);
  sqlite3VdbeAddOp1(v, OP_Return, regReturn);

  return addr;
}